

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::connection::connection(connection *this,service *srv)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
  super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::impl::cgi::connection>)._M_weak_this.
  super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_connection = (_func_int **)&PTR__connection_002b2c30;
  string_pool::string_pool(&this->pool_,0x800);
  string_map::string_map(&this->env_);
  (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->service_ = srv;
  (this->async_chunk_)._M_dataplus._M_p = (pointer)&(this->async_chunk_).field_2;
  (this->async_chunk_)._M_string_length = 0;
  (this->async_chunk_).field_2._M_local_buf[0] = '\0';
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  (this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->map_env_)._M_t._M_impl.super__Rb_tree_header;
  (this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map_env_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cached_async_write_binder_).p_ = (async_write_binder *)0x0;
  this->error_state_ = false;
  return;
}

Assistant:

connection::connection(cppcms::service &srv) :
	service_(&srv),
    error_state_(false)
{
}